

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PutVarint64(uchar *p,u64 v)

{
  ulong in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int n;
  int j;
  int i;
  u8 buf [10];
  int local_34;
  int local_30;
  int local_2c;
  ulong local_28;
  int local_18;
  undefined1 *local_12;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_12 = &DAT_aaaaaaaaaaaaaaaa;
  local_a = 0xaaaa;
  if ((in_RSI & 0xff00000000000000) == 0) {
    local_34 = 0;
    local_18 = local_34;
    local_28 = in_RSI;
    do {
      local_34 = local_18;
      local_18 = local_34 + 1;
      *(byte *)((long)&local_12 + (long)local_34) = (byte)local_28 & 0x7f | 0x80;
      local_28 = local_28 >> 7;
    } while (local_28 != 0);
    local_12 = (undefined1 *)((ulong)local_12 & 0xffffffffffffff7f);
    local_2c = 0;
    for (local_30 = local_34; -1 < local_30; local_30 = local_30 + -1) {
      *(undefined1 *)(in_RDI + local_2c) = *(undefined1 *)((long)&local_12 + (long)local_30);
      local_2c = local_2c + 1;
    }
  }
  else {
    *(char *)(in_RDI + 8) = (char)in_RSI;
    local_28 = in_RSI >> 8;
    for (local_2c = 7; -1 < local_2c; local_2c = local_2c + -1) {
      *(byte *)(in_RDI + local_2c) = (byte)local_28 & 0x7f | 0x80;
      local_28 = local_28 >> 7;
    }
    local_18 = 9;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

static int FTS5_NOINLINE fts5PutVarint64(unsigned char *p, u64 v){
  int i, j, n;
  u8 buf[10];
  if( v & (((u64)0xff000000)<<32) ){
    p[8] = (u8)v;
    v >>= 8;
    for(i=7; i>=0; i--){
      p[i] = (u8)((v & 0x7f) | 0x80);
      v >>= 7;
    }
    return 9;
  }
  n = 0;
  do{
    buf[n++] = (u8)((v & 0x7f) | 0x80);
    v >>= 7;
  }while( v!=0 );
  buf[0] &= 0x7f;
  assert( n<=9 );
  for(i=0, j=n-1; j>=0; j--, i++){
    p[i] = buf[j];
  }
  return n;
}